

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

double ON_Font::AppleFontWeightTraitFromWeight(Weight font_weight)

{
  undefined3 in_register_00000039;
  double dVar1;
  double dVar2;
  
  dVar1 = ((double)CONCAT31(in_register_00000039,font_weight) + -400.0) / 750.0;
  dVar2 = -1.0;
  if ((-1.0 <= dVar1) && (dVar2 = dVar1, 1.0 < dVar1)) {
    dVar2 = 1.0;
  }
  dVar1 = 0.0;
  if (font_weight - 1 < 9) {
    switch((uint)font_weight) {
    case 1:
      dVar1 = -0.4;
      break;
    default:
      dVar1 = (double)(-(ulong)(dVar2 < 1.0) & (ulong)dVar2 & -(ulong)(-1.0 <= dVar2));
      break;
    case 4:
      break;
    case 7:
      dVar1 = 0.4;
    }
  }
  return (double)(-(ulong)(ABS(dVar1) <= 1.0) & (ulong)dVar1);
}

Assistant:

double ON_Font::AppleFontWeightTraitFromWeight(
  ON_Font::Weight font_weight
)
{
  // These values are selected to optimize conversion of font weights between Windows and Apple platforms.
  // https://mcneel.myjetbrains.com/youtrack/issue/RH-37075


  const double default_apple_font_weight_trait = 0.0;

  double w = ((double)((int)static_cast<unsigned char>(font_weight)) - 400.0) / 750.0;
  if (w < -1.0)
    w = -1.0;
  else if (w > 1.0)
    w = 1.0;
  if (!(-1.0 <= w && w < 1.0))
    w = default_apple_font_weight_trait;
  
  double apple_font_weight_trait;
  switch (font_weight)
  {
  case ON_Font::Weight::Unset:
    apple_font_weight_trait = default_apple_font_weight_trait;
    break;
  case ON_Font::Weight::Thin:
    apple_font_weight_trait = -0.4;
    break;
  case ON_Font::Weight::Ultralight:
    apple_font_weight_trait = w;
    break;
  case ON_Font::Weight::Light:
    apple_font_weight_trait = w;
    break;
  case ON_Font::Weight::Normal:
    apple_font_weight_trait = 0.0;
    break;
  case ON_Font::Weight::Medium:
    apple_font_weight_trait = w;
    break;
  case ON_Font::Weight::Semibold:
    apple_font_weight_trait = w;
    break;
  case ON_Font::Weight::Bold:
    apple_font_weight_trait = 0.4;
    break;
  case ON_Font::Weight::Ultrabold:
    apple_font_weight_trait = w;
    break;
  case ON_Font::Weight::Heavy:
    apple_font_weight_trait = w;
    break;
  default:
    apple_font_weight_trait = default_apple_font_weight_trait;
    break;
  }

  // The valid value range is from -1.0 to 1.0. The value of 0.0 corresponds to the regular or medium font weight.
  return 
    (-1.0 <= apple_font_weight_trait && apple_font_weight_trait <= 1.0) 
    ? apple_font_weight_trait 
    : default_apple_font_weight_trait;
}